

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileOperation::
     Combine<duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::ReservoirQuantileScalarOperation>
               (ReservoirQuantileState<duckdb::hugeint_t> *source,
               ReservoirQuantileState<duckdb::hugeint_t> *target,AggregateInputData *param_3)

{
  BaseReservoirSampling *this;
  idx_t src_idx;
  ulong uVar1;
  long lVar2;
  hugeint_t element;
  
  if (source->pos != 0) {
    if (target->pos == 0) {
      ReservoirQuantileState<duckdb::hugeint_t>::Resize(target,source->len);
    }
    if (target->r_samp == (BaseReservoirSampling *)0x0) {
      this = (BaseReservoirSampling *)operator_new(0x78);
      BaseReservoirSampling::BaseReservoirSampling(this);
      target->r_samp = this;
    }
    lVar2 = 8;
    for (uVar1 = 0; uVar1 < source->pos; uVar1 = uVar1 + 1) {
      element.upper = *(int64_t *)((long)&source->v->lower + lVar2);
      element.lower = *(uint64_t *)((long)source->v + lVar2 + -8);
      ReservoirQuantileState<duckdb::hugeint_t>::FillReservoir(target,target->len,element);
      lVar2 = lVar2 + 0x10;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (source.pos == 0) {
			return;
		}
		if (target.pos == 0) {
			target.Resize(source.len);
		}
		if (!target.r_samp) {
			target.r_samp = new BaseReservoirSampling();
		}
		for (idx_t src_idx = 0; src_idx < source.pos; src_idx++) {
			target.FillReservoir(target.len, source.v[src_idx]);
		}
	}